

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CHARACTER::Load
          (_Type_CHARACTER *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Memory *this_00;
  uint id;
  Variable *v;
  Character *pCVar1;
  Object *this_01;
  String *__args;
  long *plVar2;
  long in_R8;
  code *local_a8;
  allocator<LiteScript::Character> local_85 [8];
  allocator<LiteScript::Character> allocator;
  Nullable<LiteScript::Variable> local_78;
  undefined1 local_58 [8];
  Variable V;
  uint index;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  istream *stream_local;
  _Type_CHARACTER *this_local;
  
  V.nb_ref._4_4_ = IStreamer::Read<unsigned_int>(stream);
  this_00 = object->memory;
  plVar2 = (long *)((long)(this_00->arr)._M_elems + in_R8);
  local_a8 = (code *)caller;
  if ((caller & 1) != 0) {
    local_a8 = *(code **)(*plVar2 + (caller - 1));
  }
  id = (*local_a8)(plVar2,stream);
  Memory::GetVariable(&local_78,this_00,id);
  v = Nullable<LiteScript::Variable>::operator*(&local_78);
  Variable::Variable((Variable *)local_58,v);
  Nullable<LiteScript::Variable>::~Nullable(&local_78);
  Object::Reassign(object,(Type *)_type_character,0x38);
  std::allocator<LiteScript::Character>::allocator(local_85);
  pCVar1 = Object::GetData<LiteScript::Character>(object);
  this_01 = Variable::operator->((Variable *)local_58);
  __args = Object::GetData<LiteScript::String>(this_01);
  __gnu_cxx::new_allocator<LiteScript::Character>::
  construct<LiteScript::Character,LiteScript::String&,unsigned_int&>
            ((new_allocator<LiteScript::Character> *)local_85,pCVar1,__args,
             (uint *)((long)&V.nb_ref + 4));
  pCVar1 = Object::GetData<LiteScript::Character>(object);
  Nullable<LiteScript::Variable>::operator=(&pCVar1->obj_string,(Variable *)local_58);
  std::allocator<LiteScript::Character>::~allocator(local_85);
  Variable::~Variable((Variable *)local_58);
  return;
}

Assistant:

void LiteScript::_Type_CHARACTER::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    unsigned int index = IStreamer::Read<unsigned int>(stream);
    Variable V = *object.memory.GetVariable((object.memory.*caller)(stream));
    object.Reassign(_type_character, sizeof(Character));
    std::allocator<Character> allocator;
    allocator.construct(&object.GetData<Character>(), V->GetData<String>(), index);
    object.GetData<Character>().obj_string = V;
}